

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O2

void CDiskBlockIndex::SerializationOps<DataStream,CDiskBlockIndex,ActionUnserialize>
               (long obj,DataStream *s)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock0;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
             ,0x17b,false);
  ReadVarInt<DataStream,(VarIntMode)1,int>(s);
  iVar1 = ReadVarInt<DataStream,(VarIntMode)1,int>(s);
  *(int *)(obj + 0x18) = iVar1;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  *(uint *)(obj + 0x58) = uVar2;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  *(uint *)(obj + 0x48) = uVar2;
  uVar2 = *(uint *)(obj + 0x58);
  if ((uVar2 & 0x18) != 0) {
    iVar1 = ReadVarInt<DataStream,(VarIntMode)1,int>(s);
    *(int *)(obj + 0x1c) = iVar1;
    uVar2 = *(uint *)(obj + 0x58);
  }
  if ((uVar2 & 8) != 0) {
    uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
    *(uint *)(obj + 0x20) = uVar2;
    uVar2 = *(uint *)(obj + 0x58);
  }
  if ((uVar2 & 0x10) != 0) {
    uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
    *(uint *)(obj + 0x24) = uVar2;
  }
  uVar3 = ser_readdata32<DataStream>(s);
  *(uint32_t *)(obj + 0x5c) = uVar3;
  base_blob<256U>::Unserialize<DataStream>((base_blob<256U> *)(obj + 0x94),s);
  base_blob<256U>::Unserialize<DataStream>((base_blob<256U> *)(obj + 0x60),s);
  uVar3 = ser_readdata32<DataStream>(s);
  *(uint32_t *)(obj + 0x80) = uVar3;
  uVar3 = ser_readdata32<DataStream>(s);
  *(uint32_t *)(obj + 0x84) = uVar3;
  uVar3 = ser_readdata32<DataStream>(s);
  *(uint32_t *)(obj + 0x88) = uVar3;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CDiskBlockIndex, obj)
    {
        LOCK(::cs_main);
        int _nVersion = DUMMY_VERSION;
        READWRITE(VARINT_MODE(_nVersion, VarIntMode::NONNEGATIVE_SIGNED));

        READWRITE(VARINT_MODE(obj.nHeight, VarIntMode::NONNEGATIVE_SIGNED));
        READWRITE(VARINT(obj.nStatus));
        READWRITE(VARINT(obj.nTx));
        if (obj.nStatus & (BLOCK_HAVE_DATA | BLOCK_HAVE_UNDO)) READWRITE(VARINT_MODE(obj.nFile, VarIntMode::NONNEGATIVE_SIGNED));
        if (obj.nStatus & BLOCK_HAVE_DATA) READWRITE(VARINT(obj.nDataPos));
        if (obj.nStatus & BLOCK_HAVE_UNDO) READWRITE(VARINT(obj.nUndoPos));

        // block header
        READWRITE(obj.nVersion);
        READWRITE(obj.hashPrev);
        READWRITE(obj.hashMerkleRoot);
        READWRITE(obj.nTime);
        READWRITE(obj.nBits);
        READWRITE(obj.nNonce);
    }